

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

Vec_Int_t * Abc_NtkCollectCoSupps(Abc_Ntk_t *pNtk,int fVerbose)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  abctime aVar6;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Wec_t *p_02;
  Abc_Obj_t *pAVar7;
  Vec_Int_t *pVVar8;
  void *pvVar9;
  Vec_Int_t *vArr2;
  abctime aVar10;
  abctime time;
  int iVar11;
  long lVar12;
  Vec_Int_t t;
  
  aVar6 = Abc_Clock();
  p = Abc_NtkDfs(pNtk,0);
  p_00 = Vec_IntAlloc(0);
  p_01 = Vec_IntAlloc(pNtk->vCos->nSize);
  p_02 = Vec_WecStart(pNtk->vObjs->nSize);
  for (iVar11 = 0; iVar11 < pNtk->vCis->nSize; iVar11 = iVar11 + 1) {
    pAVar7 = Abc_NtkCi(pNtk,iVar11);
    pVVar8 = Vec_WecEntry(p_02,pAVar7->Id);
    Vec_IntPush(pVVar8,iVar11);
  }
  for (iVar11 = 0; iVar11 < p->nSize; iVar11 = iVar11 + 1) {
    pvVar9 = Vec_PtrEntry(p,iVar11);
    pVVar8 = Vec_WecEntry(p_02,*(int *)((long)pvVar9 + 0x10));
    for (lVar12 = 0; lVar12 < *(int *)((long)pvVar9 + 0x1c); lVar12 = lVar12 + 1) {
      vArr2 = Vec_WecEntry(p_02,*(int *)(*(long *)((long)pvVar9 + 0x20) + lVar12 * 4));
      Vec_IntTwoMerge2(pVVar8,vArr2,p_00);
      iVar4 = pVVar8->nCap;
      iVar5 = pVVar8->nSize;
      piVar1 = pVVar8->pArray;
      iVar3 = p_00->nSize;
      piVar2 = p_00->pArray;
      pVVar8->nCap = p_00->nCap;
      pVVar8->nSize = iVar3;
      pVVar8->pArray = piVar2;
      p_00->nCap = iVar4;
      p_00->nSize = iVar5;
      p_00->pArray = piVar1;
    }
  }
  for (iVar11 = 0; iVar11 < pNtk->vCos->nSize; iVar11 = iVar11 + 1) {
    pAVar7 = Abc_NtkCo(pNtk,iVar11);
    pVVar8 = Vec_WecEntry(p_02,*(pAVar7->vFanins).pArray);
    Vec_IntPush(p_01,pVVar8->nSize);
  }
  Vec_WecFree(p_02);
  Vec_PtrFree(p);
  Vec_IntFree(p_00);
  if (fVerbose != 0) {
    aVar10 = Abc_Clock();
    Abc_PrintTime(0x6b2468,(char *)(aVar10 - aVar6),time);
  }
  return p_01;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCoSupps( Abc_Ntk_t * pNtk, int fVerbose )
{
    abctime clk = Abc_Clock();
    Abc_Obj_t * pNode; int i, k;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_Int_t * vFanin, * vFanout, * vTemp = Vec_IntAlloc( 0 );
    Vec_Int_t * vSuppsCo = Vec_IntAlloc( Abc_NtkCoNum(pNtk) );
    Vec_Wec_t * vSupps = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntPush( Vec_WecEntry(vSupps, Abc_ObjId(pNode)), i );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        vFanout = Vec_WecEntry(vSupps, Abc_ObjId(pNode));
        for ( k = 0; k < Abc_ObjFaninNum(pNode); k++ )
        {
            vFanin = Vec_WecEntry(vSupps, Abc_ObjFaninId(pNode, k));
            Vec_IntTwoMerge2( vFanout, vFanin, vTemp ); 
            ABC_SWAP( Vec_Int_t, *vFanout, *vTemp );
        }
    }
    Abc_NtkForEachCo( pNtk, pNode, i )
        Vec_IntPush( vSuppsCo, Vec_IntSize(Vec_WecEntry(vSupps, Abc_ObjFaninId0(pNode))) );
    Vec_WecFree( vSupps );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTemp );
    if ( fVerbose )
        Abc_PrintTime( 1, "Input  support computation", Abc_Clock() - clk );
    //Vec_IntPrint( vSuppsCo );
    return vSuppsCo;
}